

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error storeEntityValue(XML_Parser parser,ENCODING *enc,char *entityTextPtr,char *entityTextEnd)

{
  STRING_POOL *pool;
  XML_Char XVar1;
  int iVar2;
  XML_Error XVar3;
  uint uVar4;
  XML_Char *pXVar5;
  NAMED *pNVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  char *next;
  XML_Char buf [4];
  
  pool = (STRING_POOL *)((long)parser + 0x330);
  do {
    XVar3 = XML_ERROR_NONE;
    iVar2 = (*enc->literalScanners[1])(enc,entityTextPtr,entityTextEnd,&next);
    switch(iVar2) {
    case 0:
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = next;
        return XML_ERROR_INVALID_TOKEN;
      }
      return XML_ERROR_INVALID_TOKEN;
    case 6:
    case 9:
      pXVar5 = poolAppend(pool,enc,entityTextPtr,next);
      entityTextPtr = next;
      if (pXVar5 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 10:
      iVar2 = (*enc->charRefNumber)(enc,entityTextPtr);
      if ((iVar2 < 0) || (uVar4 = cm_expat_XmlUtf8Encode(iVar2,buf), uVar4 == 0)) {
        if (*(ENCODING **)((long)parser + 0x118) == enc) {
          *(char **)((long)parser + 0x218) = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = 0;
      }
      for (uVar8 = 0; entityTextPtr = next, uVar9 != uVar8; uVar8 = uVar8 + 1) {
        pXVar5 = *(XML_Char **)((long)parser + 0x348);
        if (*(XML_Char **)((long)parser + 0x340) == pXVar5) {
          iVar2 = poolGrow(pool);
          if (iVar2 == 0) {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar5 = *(XML_Char **)((long)parser + 0x348);
        }
        XVar1 = buf[uVar8];
        *(XML_Char **)((long)parser + 0x348) = pXVar5 + 1;
        *pXVar5 = XVar1;
      }
      break;
    case -4:
      goto switchD_0014ff13_caseD_fffffffc;
    case -3:
      next = entityTextPtr + enc->minBytesPerChar;
    case 7:
      puVar7 = *(undefined1 **)((long)parser + 0x348);
      if (*(undefined1 **)((long)parser + 0x340) == puVar7) {
        iVar2 = poolGrow(pool);
        if (iVar2 == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        puVar7 = *(undefined1 **)((long)parser + 0x348);
      }
      *(undefined1 **)((long)parser + 0x348) = puVar7 + 1;
      *puVar7 = 10;
      entityTextPtr = next;
      break;
    case -2:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
switchD_0014ff13_caseD_fffffffe:
      XVar3 = XML_ERROR_UNEXPECTED_STATE;
LAB_001500fc:
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = entityTextPtr;
        return XVar3;
      }
      return XVar3;
    case -1:
      XVar3 = XML_ERROR_INVALID_TOKEN;
      goto LAB_001500fc;
    default:
      if (iVar2 != 0x1c) goto switchD_0014ff13_caseD_fffffffe;
      if ((*(long *)((long)parser + 0x490) == 0) && (*(ENCODING **)((long)parser + 0x118) == enc)) {
        *(char **)((long)parser + 0x218) = entityTextPtr;
        return XML_ERROR_SYNTAX;
      }
      pXVar5 = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,
                               entityTextPtr + enc->minBytesPerChar,
                               next + -(long)enc->minBytesPerChar);
      if (pXVar5 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pNVar6 = lookup((HASH_TABLE *)((long)parser + 0x368),pXVar5,0);
      *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
      if (pNVar6 == (NAMED *)0x0) {
        XVar3 = XML_ERROR_UNDEFINED_ENTITY;
        goto LAB_001500fc;
      }
      if (*(char *)&pNVar6[7].name != '\0') {
        XVar3 = XML_ERROR_RECURSIVE_ENTITY_REF;
        goto LAB_001500fc;
      }
      if (pNVar6[3].name != (KEY)0x0) {
        XVar3 = XML_ERROR_PARAM_ENTITY_REF;
        goto LAB_001500fc;
      }
      *(undefined1 *)&pNVar6[7].name = 1;
      XVar3 = storeEntityValue(parser,*(ENCODING **)((long)parser + 0x1b8),pNVar6[1].name,
                               pNVar6[1].name + *(int *)&pNVar6[2].name);
      *(undefined1 *)&pNVar6[7].name = 0;
      entityTextPtr = next;
      if (XVar3 != XML_ERROR_NONE) {
switchD_0014ff13_caseD_fffffffc:
        return XVar3;
      }
    }
  } while( true );
}

Assistant:

static
enum XML_Error storeEntityValue(XML_Parser parser,
                                const ENCODING *enc,
                                const char *entityTextPtr,
                                const char *entityTextEnd)
{
  STRING_POOL *pool = &(dtd.pool);
  for (;;) {
    const char *next;
    int tok = XmlEntityValueTok(enc, entityTextPtr, entityTextEnd, &next);
    switch (tok) {
    case XML_TOK_PARAM_ENTITY_REF:
#ifdef XML_DTD
      if (parentParser || enc != encoding) {
        enum XML_Error result;
        const XML_Char *name;
        ENTITY *entity;
        name = poolStoreString(&tempPool, enc,
                               entityTextPtr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.paramEntities, name, 0);
        poolDiscard(&tempPool);
        if (!entity) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (entity->open) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->systemId) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_PARAM_ENTITY_REF;
        }
        entity->open = 1;
        result = storeEntityValue(parser,
                                  internalEncoding,
                                  (char *)entity->textPtr,
                                  (char *)(entity->textPtr + entity->textLen));
        entity->open = 0;
        if (result)
          return result;
        break;
      }
#endif /* XML_DTD */
      eventPtr = entityTextPtr;
      return XML_ERROR_SYNTAX;
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_ENTITY_REF:
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, entityTextPtr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = entityTextPtr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_DATA_NEWLINE:
      if (pool->end == pool->ptr && !poolGrow(pool))
        return XML_ERROR_NO_MEMORY;
      *(pool->ptr)++ = 0xA;
      break;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, entityTextPtr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (pool->end == pool->ptr && !poolGrow(pool))
            return XML_ERROR_NO_MEMORY;
          *(pool->ptr)++ = buf[i];
        }
      }
      break;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    default:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    entityTextPtr = next;
  }
  /* not reached */
}